

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestCase(FILE *out,TestCase *test_case)

{
  pointer ppTVar1;
  pointer ppTVar2;
  undefined8 uVar3;
  uint uVar4;
  pointer ppTVar5;
  TimeInMillis extraout_RDX;
  TimeInMillis extraout_RDX_00;
  TimeInMillis ms;
  ulong uVar6;
  long lVar7;
  stringstream stream;
  char *local_1c8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  EscapeXml((XmlUnitTestResultPrinter *)local_1b8,(test_case->name_).c_str_,true);
  uVar3 = local_1b8._0_8_;
  ppTVar1 = (test_case->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppTVar2 = (test_case->test_info_list_).
            super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar4 = TestCase::failed_test_count(test_case);
  uVar6 = 0;
  for (ppTVar5 = (test_case->test_info_list_).
                 super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar5 !=
      (test_case->test_info_list_).
      super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar5 = ppTVar5 + 1) {
    uVar6 = (ulong)((int)uVar6 + (uint)(*ppTVar5)->is_disabled_);
  }
  fprintf((FILE *)out,"  <testsuite name=\"%s\" tests=\"%d\" failures=\"%d\" disabled=\"%d\" ",uVar3
          ,(ulong)((long)ppTVar1 - (long)ppTVar2) >> 3 & 0xffffffff,(ulong)uVar4,uVar6);
  ms = extraout_RDX;
  if ((_func_int **)local_1b8._0_8_ != (_func_int **)0x0) {
    operator_delete__((void *)local_1b8._0_8_);
    ms = extraout_RDX_00;
  }
  FormatTimeInMillisAsSeconds_abi_cxx11_
            ((string *)local_1b8,(internal *)test_case->elapsed_time_,ms);
  fprintf((FILE *)out,"errors=\"0\" time=\"%s\">\n",local_1b8._0_8_);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
  }
  if (0 < (int)((ulong)((long)(test_case->test_info_list_).
                              super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(test_case->test_info_list_).
                             super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar7 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      OutputXmlTestInfo((ostream *)(local_1b8 + 0x10),(test_case->name_).c_str_,
                        (test_case->test_info_list_).
                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [(uint)(test_case->test_indices_).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar7]]);
      StringStreamToString((internal *)local_1c8,(stringstream *)local_1b8);
      fputs(local_1c8[0],(FILE *)out);
      if (local_1c8[0] != (char *)0x0) {
        operator_delete__(local_1c8[0]);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (int)((ulong)((long)(test_case->test_info_list_).
                                         super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(test_case->test_info_list_).
                                        super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  fwrite("  </testsuite>\n",0xf,1,(FILE *)out);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestCase(FILE* out,
                                                const TestCase& test_case) {
  fprintf(out,
          "  <testsuite name=\"%s\" tests=\"%d\" failures=\"%d\" "
          "disabled=\"%d\" ",
          EscapeXmlAttribute(test_case.name()).c_str(),
          test_case.total_test_count(),
          test_case.failed_test_count(),
          test_case.disabled_test_count());
  fprintf(out,
          "errors=\"0\" time=\"%s\">\n",
          FormatTimeInMillisAsSeconds(test_case.elapsed_time()).c_str());
  for (int i = 0; i < test_case.total_test_count(); ++i) {
    ::std::stringstream stream;
    OutputXmlTestInfo(&stream, test_case.name(), *test_case.GetTestInfo(i));
    fprintf(out, "%s", StringStreamToString(&stream).c_str());
  }
  fprintf(out, "  </testsuite>\n");
}